

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_interfaces.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::GetLocationsForVariable
          (ValidationState_t *_,Instruction *entry_point,Instruction *variable,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *locations,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *output_index1_locations)

{
  value_type vVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  ExecutionModel EVar8;
  StorageClass SVar9;
  uint uVar10;
  uint32_t uVar11;
  Op OVar12;
  spv_result_t sVar13;
  Decoration DVar14;
  uint id;
  Instruction *this;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *psVar15;
  DiagnosticStream *pDVar16;
  char *__s;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar17;
  const_reference pvVar18;
  ulong uVar19;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *this_00;
  size_type sVar20;
  pointer ppVar21;
  size_type sVar22;
  mapped_type *pmVar23;
  bool bVar24;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar25;
  uint local_1628;
  uint local_1624;
  string local_1620;
  DiagnosticStream local_1600;
  _Node_iterator_base<unsigned_int,_false> local_1428;
  byte local_1420;
  _Node_iterator_base<unsigned_int,_false> local_1418;
  byte local_1410;
  uint local_1408;
  uint local_1404;
  uint32_t l_1;
  uint32_t end_1;
  DiagnosticStream local_13e0;
  _Node_iterator_base<unsigned_int,_false> local_1208;
  byte local_1200;
  _Node_iterator_base<unsigned_int,_false> local_11f8;
  byte local_11f0;
  value_type local_11e4;
  uint local_11e0;
  uint32_t check;
  uint32_t c;
  uint32_t l;
  uint32_t start_1;
  uint32_t local_11cc;
  spv_result_t local_11c8;
  uint32_t num_components_1;
  spv_result_t error_1;
  uint32_t num_locations_1;
  Instruction *member;
  string local_11b0;
  DiagnosticStream local_1190;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_fb8;
  key_type local_fac;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_fa8;
  iterator where_2;
  uint32_t i_1;
  key_type local_dbc;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_db8;
  key_type local_dac;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_da8;
  iterator where_1;
  DiagnosticStream local_d98;
  key_type local_bbc;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_bb8;
  key_type local_bac;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_ba8;
  iterator where;
  Decoration *dec_1;
  iterator __end3;
  iterator __begin3;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *__range3;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  member_components;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  member_locations;
  string local_b08;
  DiagnosticStream local_ae8;
  _Node_iterator_base<unsigned_int,_false> local_910;
  byte local_908;
  _Node_iterator_base<unsigned_int,_false> local_900;
  byte local_8f8;
  uint local_8ec;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *puStack_8e8;
  uint32_t i;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *locs;
  uint local_8d8;
  uint32_t end;
  uint32_t start;
  uint32_t array_location;
  uint32_t array_idx;
  uint32_t num_components;
  uint32_t local_8c0;
  spv_result_t error;
  uint32_t num_locations;
  uint sub_type_id;
  tuple<bool,_bool,_unsigned_int> local_8a0;
  uint local_898;
  bool local_892;
  bool local_891;
  uint32_t array_size;
  bool is_const;
  bool is_int;
  Instruction *sub_type;
  undefined1 local_880 [8];
  string storage_class;
  DiagnosticStream local_840;
  uint32_t local_668;
  undefined1 local_662;
  byte local_661;
  int vuid;
  bool is_block;
  bool is_arrayed;
  DiagnosticStream local_640;
  string local_468;
  DiagnosticStream local_448;
  DiagnosticStream local_270;
  Decoration *local_98;
  Decoration *dec;
  iterator __end2;
  iterator __begin2;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *__range2;
  bool has_per_vertex_khr;
  bool has_per_task_nv;
  bool has_patch;
  uint32_t index;
  value_type vStack_68;
  bool has_index;
  uint32_t component;
  uint32_t location;
  bool has_location;
  Instruction *type;
  uint type_id;
  Instruction *ptr_type;
  uint ptr_type_id;
  bool is_output;
  uint sc_index;
  bool is_fragment;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *output_index1_locations_local;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *locations_local;
  Instruction *variable_local;
  Instruction *entry_point_local;
  ValidationState_t *__local;
  
  EVar8 = Instruction::GetOperandAs<spv::ExecutionModel>(entry_point,0);
  SVar9 = Instruction::GetOperandAs<spv::StorageClass>(variable,2);
  bVar24 = SVar9 == Output;
  uVar10 = Instruction::GetOperandAs<unsigned_int>(variable,0);
  this = ValidationState_t::FindDef(_,uVar10);
  type._4_4_ = Instruction::GetOperandAs<unsigned_int>(this,2);
  _location = ValidationState_t::FindDef(_,type._4_4_);
  bVar4 = false;
  vStack_68 = 0;
  index = 0;
  bVar5 = false;
  __range2._4_4_ = 0;
  bVar7 = false;
  bVar3 = false;
  bVar2 = false;
  uVar11 = Instruction::id(variable);
  psVar15 = ValidationState_t::id_decorations(_,uVar11);
  __end2 = std::
           set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
           ::begin(psVar15);
  dec = (Decoration *)
        std::
        set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
        ::end(psVar15);
  while (bVar6 = std::operator!=(&__end2,(_Self *)&dec), bVar6) {
    local_98 = std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator*(&__end2);
    DVar14 = Decoration::dec_type(local_98);
    if (DVar14 == Location) {
      bVar4 = true;
      pvVar17 = Decoration::params(local_98);
      pvVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar17,0);
      vStack_68 = *pvVar18;
    }
    else {
      DVar14 = Decoration::dec_type(local_98);
      if (DVar14 == Component) {
        pvVar17 = Decoration::params(local_98);
        pvVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar17,0);
        index = *pvVar18;
      }
      else {
        DVar14 = Decoration::dec_type(local_98);
        if (DVar14 == Index) {
          if ((!bVar24) || (EVar8 != Fragment)) {
            ValidationState_t::diag(&local_270,_,SPV_ERROR_INVALID_DATA,variable);
            pDVar16 = DiagnosticStream::operator<<
                                (&local_270,
                                 (char (*) [55])
                                 "Index can only be applied to Fragment output variables");
            sVar13 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar16);
            DiagnosticStream::~DiagnosticStream(&local_270);
            return sVar13;
          }
          bVar5 = true;
          pvVar17 = Decoration::params(local_98);
          pvVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar17,0);
          __range2._4_4_ = *pvVar18;
        }
        else {
          DVar14 = Decoration::dec_type(local_98);
          if (DVar14 == BuiltIn) {
            return SPV_SUCCESS;
          }
          DVar14 = Decoration::dec_type(local_98);
          if (DVar14 == Patch) {
            bVar7 = true;
          }
          else {
            DVar14 = Decoration::dec_type(local_98);
            if (DVar14 == PerTaskNV) {
              bVar3 = true;
            }
            else {
              DVar14 = Decoration::dec_type(local_98);
              if (DVar14 == PerVertexKHR) {
                if (EVar8 != Fragment) {
                  ValidationState_t::diag(&local_448,_,SPV_ERROR_INVALID_DATA,variable);
                  ValidationState_t::VkErrorID_abi_cxx11_(&local_468,_,0x1a79,(char *)0x0);
                  pDVar16 = DiagnosticStream::operator<<(&local_448,&local_468);
                  pDVar16 = DiagnosticStream::operator<<
                                      (pDVar16,(char (*) [62])
                                               "PerVertexKHR can only be applied to Fragment Execution Models"
                                      );
                  sVar13 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar16);
                  std::__cxx11::string::~string((string *)&local_468);
                  DiagnosticStream::~DiagnosticStream(&local_448);
                  return sVar13;
                }
                OVar12 = Instruction::opcode(_location);
                if ((OVar12 != OpTypeArray) &&
                   (OVar12 = Instruction::opcode(_location), OVar12 != OpTypeRuntimeArray)) {
                  ValidationState_t::diag(&local_640,_,SPV_ERROR_INVALID_DATA,variable);
                  ValidationState_t::VkErrorID_abi_cxx11_((string *)&vuid,_,0x1a7a,(char *)0x0);
                  pDVar16 = DiagnosticStream::operator<<
                                      (&local_640,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&vuid);
                  pDVar16 = DiagnosticStream::operator<<
                                      (pDVar16,(char (*) [40])
                                               "PerVertexKHR must be declared as arrays");
                  sVar13 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar16);
                  std::__cxx11::string::~string((string *)&vuid);
                  DiagnosticStream::~DiagnosticStream(&local_640);
                  return sVar13;
                }
                bVar2 = true;
              }
            }
          }
        }
      }
    }
    std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator++(&__end2);
  }
  local_661 = 0;
  EVar8 = Instruction::GetOperandAs<spv::ExecutionModel>(entry_point,0);
  if (EVar8 == TessellationControl) {
    if (!bVar7) {
      local_661 = 1;
    }
  }
  else if (EVar8 == TessellationEvaluation) {
    if ((!bVar24) && (!bVar7)) {
      local_661 = 1;
    }
  }
  else if (EVar8 == Geometry) {
    if (!bVar24) {
      local_661 = 1;
    }
  }
  else if (EVar8 == Fragment) {
    if ((!bVar24) && (bVar2)) {
      local_661 = 1;
    }
  }
  else if (((EVar8 == MeshNV) && (bVar24)) && (!bVar3)) {
    local_661 = 1;
  }
  if (((local_661 & 1) != 0) &&
     ((OVar12 = Instruction::opcode(_location), OVar12 == OpTypeArray ||
      (OVar12 = Instruction::opcode(_location), OVar12 == OpTypeRuntimeArray)))) {
    type._4_4_ = Instruction::GetOperandAs<unsigned_int>(_location,1);
    _location = ValidationState_t::FindDef(_,type._4_4_);
  }
  OVar12 = Instruction::opcode(_location);
  if ((OVar12 == OpTypeStruct) &&
     (bVar7 = ValidationState_t::HasDecoration(_,type._4_4_,BuiltIn), bVar7)) {
    return SPV_SUCCESS;
  }
  local_662 = ValidationState_t::HasDecoration(_,type._4_4_,Block);
  if ((!bVar4) && (!(bool)local_662)) {
    OVar12 = Instruction::opcode(_location);
    local_668 = 0x1334;
    if (OVar12 == OpTypeStruct) {
      local_668 = 0x1335;
    }
    ValidationState_t::diag(&local_840,_,SPV_ERROR_INVALID_DATA,variable);
    ValidationState_t::VkErrorID_abi_cxx11_
              ((string *)((long)&storage_class.field_2 + 8),_,local_668,(char *)0x0);
    pDVar16 = DiagnosticStream::operator<<
                        (&local_840,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&storage_class.field_2 + 8));
    pDVar16 = DiagnosticStream::operator<<
                        (pDVar16,(char (*) [43])"Variable must be decorated with a location");
    sVar13 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar16);
    std::__cxx11::string::~string((string *)(storage_class.field_2._M_local_buf + 8));
    DiagnosticStream::~DiagnosticStream(&local_840);
    return sVar13;
  }
  __s = "input";
  if (bVar24) {
    __s = "output";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_880,__s,(allocator<char> *)((long)&sub_type + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&sub_type + 7));
  if (bVar4) {
    _array_size = _location;
    local_891 = false;
    local_892 = false;
    local_898 = 1;
    OVar12 = Instruction::opcode(_location);
    if (OVar12 == OpTypeArray) {
      uVar10 = Instruction::GetOperandAs<unsigned_int>(_location,2);
      ValidationState_t::EvalInt32IfConst(&local_8a0,_,uVar10);
      std::tie<bool,bool,unsigned_int>
                ((tuple<bool_&,_bool_&,_unsigned_int_&> *)&num_locations,&local_891,&local_892,
                 &local_898);
      std::tuple<bool&,bool&,unsigned_int&>::operator=
                ((tuple<bool&,bool&,unsigned_int&> *)&num_locations,&local_8a0);
      if (((local_891 & 1U) == 0) || ((local_892 & 1U) == 0)) {
        local_898 = 1;
      }
      error = Instruction::GetOperandAs<unsigned_int>(_location,1);
      _array_size = ValidationState_t::FindDef(_,error);
    }
    local_8c0 = 0;
    num_components = NumConsumedLocations(_,_array_size,&local_8c0);
    if (num_components != SPV_SUCCESS) {
      array_idx = 1;
      __local._4_4_ = num_components;
      goto LAB_00577608;
    }
    array_location = NumConsumedComponents(_,_array_size);
    for (start = 0; start < local_898; start = start + 1) {
      end = vStack_68 + local_8c0 * start;
      local_8d8 = end * 4;
      if (0x3fff < local_8d8) break;
      locs._4_4_ = (end + local_8c0) * 4;
      if (array_location != 0) {
        local_8d8 = index + local_8d8;
        locs._4_4_ = end * 4 + index + array_location;
      }
      puStack_8e8 = locations;
      if ((bVar5) && (__range2._4_4_ == 1)) {
        puStack_8e8 = output_index1_locations;
      }
      for (local_8ec = local_8d8; local_8ec < locs._4_4_; local_8ec = local_8ec + 1) {
        pVar25 = std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::insert(puStack_8e8,&local_8ec);
        local_910._M_cur =
             (__node_type *)pVar25.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
        local_908 = pVar25.second;
        local_900._M_cur = local_910._M_cur;
        local_8f8 = local_908;
        if (((local_908 ^ 0xff) & 1) != 0) {
          ValidationState_t::diag(&local_ae8,_,SPV_ERROR_INVALID_DATA,entry_point);
          if (bVar24) {
            ValidationState_t::VkErrorID_abi_cxx11_(&local_b08,_,0x2212,(char *)0x0);
          }
          else {
            ValidationState_t::VkErrorID_abi_cxx11_(&local_b08,_,0x2211,(char *)0x0);
          }
          pDVar16 = DiagnosticStream::operator<<(&local_ae8,&local_b08);
          pDVar16 = DiagnosticStream::operator<<
                              (pDVar16,(char (*) [29])"Entry-point has conflicting ");
          pDVar16 = DiagnosticStream::operator<<
                              (pDVar16,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_880);
          pDVar16 = DiagnosticStream::operator<<
                              (pDVar16,(char (*) [34])" location assignment at location ");
          member_locations._M_h._M_single_bucket._4_4_ = local_8ec >> 2;
          pDVar16 = DiagnosticStream::operator<<
                              (pDVar16,(uint *)((long)&member_locations._M_h._M_single_bucket + 4));
          pDVar16 = DiagnosticStream::operator<<(pDVar16,(char (*) [13])", component ");
          member_locations._M_h._M_single_bucket._0_4_ = local_8ec & 3;
          pDVar16 = DiagnosticStream::operator<<
                              (pDVar16,(uint *)&member_locations._M_h._M_single_bucket);
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar16);
          std::__cxx11::string::~string((string *)&local_b08);
          DiagnosticStream::~DiagnosticStream(&local_ae8);
          array_idx = 1;
          goto LAB_00577608;
        }
      }
    }
  }
  else {
    std::
    unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                     *)&member_components._M_h._M_single_bucket);
    std::
    unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                     *)&__range3);
    psVar15 = ValidationState_t::id_decorations(_,type._4_4_);
    __end3 = std::
             set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
             ::begin(psVar15);
    dec_1 = (Decoration *)
            std::
            set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
            ::end(psVar15);
    while (bVar7 = std::operator!=(&__end3,(_Self *)&dec_1), bVar7) {
      where.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur =
           (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)
           std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator*(&__end3);
      DVar14 = Decoration::dec_type
                         ((Decoration *)
                          where.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                          ._M_cur);
      if (DVar14 == Location) {
        local_bac = Decoration::struct_member_index
                              ((Decoration *)
                               where.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                               ._M_cur);
        local_ba8._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::find((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                     *)&member_components._M_h._M_single_bucket,&local_bac);
        local_bb8._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::end((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    *)&member_components._M_h._M_single_bucket);
        bVar7 = std::__detail::operator==(&local_ba8,&local_bb8);
        if (bVar7) {
          pvVar17 = Decoration::params((Decoration *)
                                       where.
                                       super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                       ._M_cur);
          pvVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar17,0);
          vVar1 = *pvVar18;
          local_bbc = Decoration::struct_member_index
                                ((Decoration *)
                                 where.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                 ._M_cur);
          pmVar23 = std::
                    unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    ::operator[]((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                  *)&member_components._M_h._M_single_bucket,&local_bbc);
          *pmVar23 = vVar1;
        }
        else {
          ppVar21 = std::__detail::
                    _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                    operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                                *)&local_ba8);
          uVar10 = ppVar21->second;
          pvVar17 = Decoration::params((Decoration *)
                                       where.
                                       super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                       ._M_cur);
          pvVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar17,0);
          if (uVar10 != *pvVar18) {
            ValidationState_t::diag(&local_d98,_,SPV_ERROR_INVALID_DATA,_location);
            pDVar16 = DiagnosticStream::operator<<(&local_d98,(char (*) [14])"Member index ");
            where_1.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
            _M_cur._4_4_ = Decoration::struct_member_index
                                     ((Decoration *)
                                      where.
                                      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                      ._M_cur);
            pDVar16 = DiagnosticStream::operator<<
                                (pDVar16,(int *)((long)&where_1.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                                  ._M_cur + 4));
            pDVar16 = DiagnosticStream::operator<<
                                (pDVar16,(char (*) [38])" has conflicting location assignments");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar16);
            DiagnosticStream::~DiagnosticStream(&local_d98);
            array_idx = 1;
            goto LAB_005775d1;
          }
        }
      }
      else {
        DVar14 = Decoration::dec_type
                           ((Decoration *)
                            where.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                            ._M_cur);
        if (DVar14 == Component) {
          local_dac = Decoration::struct_member_index
                                ((Decoration *)
                                 where.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                 ._M_cur);
          local_da8._M_cur =
               (__node_type *)
               std::
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::find((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                       *)&__range3,&local_dac);
          local_db8._M_cur =
               (__node_type *)
               std::
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::end((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                      *)&__range3);
          bVar7 = std::__detail::operator==(&local_da8,&local_db8);
          if (bVar7) {
            pvVar17 = Decoration::params((Decoration *)
                                         where.
                                         super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                         ._M_cur);
            pvVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (pvVar17,0);
            vVar1 = *pvVar18;
            local_dbc = Decoration::struct_member_index
                                  ((Decoration *)
                                   where.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                   ._M_cur);
            pmVar23 = std::
                      unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                      ::operator[]((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                    *)&__range3,&local_dbc);
            *pmVar23 = vVar1;
          }
          else {
            ppVar21 = std::__detail::
                      _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                      operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                                  *)&local_da8);
            uVar10 = ppVar21->second;
            pvVar17 = Decoration::params((Decoration *)
                                         where.
                                         super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                         ._M_cur);
            pvVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (pvVar17,0);
            if (uVar10 != *pvVar18) {
              ValidationState_t::diag((DiagnosticStream *)&i_1,_,SPV_ERROR_INVALID_DATA,_location);
              pDVar16 = DiagnosticStream::operator<<
                                  ((DiagnosticStream *)&i_1,(char (*) [14])"Member index ");
              where_2.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
              _M_cur._4_4_ = Decoration::struct_member_index
                                       ((Decoration *)
                                        where.
                                        super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                        ._M_cur);
              pDVar16 = DiagnosticStream::operator<<
                                  (pDVar16,(int *)((long)&where_2.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                                  ._M_cur + 4));
              pDVar16 = DiagnosticStream::operator<<
                                  (pDVar16,(char (*) [39])" has conflicting component assignments");
              __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar16);
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&i_1);
              array_idx = 1;
              goto LAB_005775d1;
            }
          }
        }
      }
      std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator++(&__end3);
    }
    where_2.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur.
    _0_4_ = 1;
    while( true ) {
      uVar19 = (ulong)(uint)where_2.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                            ._M_cur;
      this_00 = Instruction::operands(_location);
      sVar20 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size
                         (this_00);
      if (sVar20 <= uVar19) break;
      local_fac = (uint)where_2.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                        ._M_cur - 1;
      local_fa8._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::find((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)&member_components._M_h._M_single_bucket,&local_fac);
      local_fb8._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::end((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  *)&member_components._M_h._M_single_bucket);
      bVar7 = std::__detail::operator==(&local_fa8,&local_fb8);
      if (bVar7) {
        ValidationState_t::diag(&local_1190,_,SPV_ERROR_INVALID_DATA,_location);
        ValidationState_t::VkErrorID_abi_cxx11_(&local_11b0,_,0x1337,(char *)0x0);
        pDVar16 = DiagnosticStream::operator<<(&local_1190,&local_11b0);
        pDVar16 = DiagnosticStream::operator<<(pDVar16,(char (*) [14])"Member index ");
        member._4_4_ = (uint)where_2.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                             ._M_cur - 1;
        pDVar16 = DiagnosticStream::operator<<(pDVar16,(uint *)((long)&member + 4));
        pDVar16 = DiagnosticStream::operator<<
                            (pDVar16,(char (*) [34])" is missing a location assignment");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar16);
        std::__cxx11::string::~string((string *)&local_11b0);
        DiagnosticStream::~DiagnosticStream(&local_1190);
        array_idx = 1;
        goto LAB_005775d1;
      }
      ppVar21 = std::__detail::
                _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                            *)&local_fa8);
      uVar10 = ppVar21->second;
      id = Instruction::GetOperandAs<unsigned_int>
                     (_location,
                      (ulong)(uint)where_2.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                   ._M_cur);
      _error_1 = ValidationState_t::FindDef(_,id);
      num_components_1 = 0;
      local_11c8 = NumConsumedLocations(_,_error_1,&num_components_1);
      if (local_11c8 != SPV_SUCCESS) {
        array_idx = 1;
        __local._4_4_ = local_11c8;
        goto LAB_005775d1;
      }
      local_11cc = NumConsumedComponents(_,_error_1);
      index = 0;
      start_1 = (uint)where_2.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                      _M_cur - 1;
      sVar22 = std::
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::count((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                        *)&__range3,&start_1);
      if (sVar22 != 0) {
        l = (uint)where_2.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                  _M_cur - 1;
        pmVar23 = std::
                  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  ::operator[]((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                *)&__range3,&l);
        index = *pmVar23;
      }
      c = uVar10 << 2;
      if (c < 0x4000) {
        OVar12 = Instruction::opcode(_error_1);
        if (((OVar12 == OpTypeArray) && (local_11cc != 0)) && (uVar11 = uVar10, local_11cc < 4)) {
          while (check = uVar11, check < num_components_1 + uVar10) {
            for (local_11e0 = index; local_11e0 < index + local_11cc; local_11e0 = local_11e0 + 1) {
              local_11e4 = local_11e0 + check * 4;
              pVar25 = std::
                       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       ::insert(locations,&local_11e4);
              local_1208._M_cur =
                   (__node_type *)pVar25.first.super__Node_iterator_base<unsigned_int,_false>._M_cur
              ;
              local_1200 = pVar25.second;
              local_11f8._M_cur = local_1208._M_cur;
              local_11f0 = local_1200;
              if (((local_1200 ^ 0xff) & 1) != 0) {
                ValidationState_t::diag(&local_13e0,_,SPV_ERROR_INVALID_DATA,entry_point);
                if (bVar24) {
                  ValidationState_t::VkErrorID_abi_cxx11_((string *)&l_1,_,0x2212,(char *)0x0);
                }
                else {
                  ValidationState_t::VkErrorID_abi_cxx11_((string *)&l_1,_,0x2211,(char *)0x0);
                }
                pDVar16 = DiagnosticStream::operator<<
                                    (&local_13e0,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&l_1);
                pDVar16 = DiagnosticStream::operator<<
                                    (pDVar16,(char (*) [29])"Entry-point has conflicting ");
                pDVar16 = DiagnosticStream::operator<<
                                    (pDVar16,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_880);
                pDVar16 = DiagnosticStream::operator<<
                                    (pDVar16,(char (*) [34])" location assignment at location ");
                pDVar16 = DiagnosticStream::operator<<(pDVar16,&check);
                pDVar16 = DiagnosticStream::operator<<(pDVar16,(char (*) [13])", component ");
                pDVar16 = DiagnosticStream::operator<<(pDVar16,&local_11e0);
                __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar16);
                std::__cxx11::string::~string((string *)&l_1);
                DiagnosticStream::~DiagnosticStream(&local_13e0);
                array_idx = 1;
                goto LAB_005775d1;
              }
            }
            uVar11 = check + 1;
          }
        }
        else {
          local_1404 = (uVar10 + num_components_1) * 4;
          if (local_11cc != 0) {
            c = index + c;
            local_1404 = uVar10 * 4 + index + local_11cc;
          }
          for (local_1408 = c; local_1408 < local_1404; local_1408 = local_1408 + 1) {
            pVar25 = std::
                     unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::insert(locations,&local_1408);
            local_1428._M_cur =
                 (__node_type *)pVar25.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
            local_1420 = pVar25.second;
            local_1418._M_cur = local_1428._M_cur;
            local_1410 = local_1420;
            if (((local_1420 ^ 0xff) & 1) != 0) {
              ValidationState_t::diag(&local_1600,_,SPV_ERROR_INVALID_DATA,entry_point);
              if (bVar24) {
                ValidationState_t::VkErrorID_abi_cxx11_(&local_1620,_,0x2212,(char *)0x0);
              }
              else {
                ValidationState_t::VkErrorID_abi_cxx11_(&local_1620,_,0x2211,(char *)0x0);
              }
              pDVar16 = DiagnosticStream::operator<<(&local_1600,&local_1620);
              pDVar16 = DiagnosticStream::operator<<
                                  (pDVar16,(char (*) [29])"Entry-point has conflicting ");
              pDVar16 = DiagnosticStream::operator<<
                                  (pDVar16,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_880);
              pDVar16 = DiagnosticStream::operator<<
                                  (pDVar16,(char (*) [34])" location assignment at location ");
              local_1624 = local_1408 >> 2;
              pDVar16 = DiagnosticStream::operator<<(pDVar16,&local_1624);
              pDVar16 = DiagnosticStream::operator<<(pDVar16,(char (*) [13])", component ");
              local_1628 = local_1408 & 3;
              pDVar16 = DiagnosticStream::operator<<(pDVar16,&local_1628);
              __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar16);
              std::__cxx11::string::~string((string *)&local_1620);
              DiagnosticStream::~DiagnosticStream(&local_1600);
              array_idx = 1;
              goto LAB_005775d1;
            }
          }
        }
      }
      where_2.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur.
      _0_4_ = (uint)where_2.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                    _M_cur + 1;
    }
    array_idx = 0;
LAB_005775d1:
    std::
    unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::~unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                      *)&__range3);
    std::
    unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::~unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                      *)&member_components._M_h._M_single_bucket);
    if (array_idx != 0) goto LAB_00577608;
  }
  __local._4_4_ = SPV_SUCCESS;
  array_idx = 1;
LAB_00577608:
  std::__cxx11::string::~string((string *)local_880);
  return __local._4_4_;
}

Assistant:

spv_result_t GetLocationsForVariable(
    ValidationState_t& _, const Instruction* entry_point,
    const Instruction* variable, std::unordered_set<uint32_t>* locations,
    std::unordered_set<uint32_t>* output_index1_locations) {
  const bool is_fragment = entry_point->GetOperandAs<spv::ExecutionModel>(0) ==
                           spv::ExecutionModel::Fragment;
  const auto sc_index = 2u;
  const bool is_output = variable->GetOperandAs<spv::StorageClass>(sc_index) ==
                         spv::StorageClass::Output;
  auto ptr_type_id = variable->GetOperandAs<uint32_t>(0);
  auto ptr_type = _.FindDef(ptr_type_id);
  auto type_id = ptr_type->GetOperandAs<uint32_t>(2);
  auto type = _.FindDef(type_id);

  // Check for Location, Component and Index decorations on the variable. The
  // validator allows duplicate decorations if the location/component/index are
  // equal. Also track Patch and PerTaskNV decorations.
  bool has_location = false;
  uint32_t location = 0;
  uint32_t component = 0;
  bool has_index = false;
  uint32_t index = 0;
  bool has_patch = false;
  bool has_per_task_nv = false;
  bool has_per_vertex_khr = false;
  // Duplicate Location, Component, Index are checked elsewhere.
  for (auto& dec : _.id_decorations(variable->id())) {
    if (dec.dec_type() == spv::Decoration::Location) {
      has_location = true;
      location = dec.params()[0];
    } else if (dec.dec_type() == spv::Decoration::Component) {
      component = dec.params()[0];
    } else if (dec.dec_type() == spv::Decoration::Index) {
      if (!is_output || !is_fragment) {
        return _.diag(SPV_ERROR_INVALID_DATA, variable)
               << "Index can only be applied to Fragment output variables";
      }
      has_index = true;
      index = dec.params()[0];
    } else if (dec.dec_type() == spv::Decoration::BuiltIn) {
      // Don't check built-ins.
      return SPV_SUCCESS;
    } else if (dec.dec_type() == spv::Decoration::Patch) {
      has_patch = true;
    } else if (dec.dec_type() == spv::Decoration::PerTaskNV) {
      has_per_task_nv = true;
    } else if (dec.dec_type() == spv::Decoration::PerVertexKHR) {
      if (!is_fragment) {
        return _.diag(SPV_ERROR_INVALID_DATA, variable)
               << _.VkErrorID(6777)
               << "PerVertexKHR can only be applied to Fragment Execution "
                  "Models";
      }
      if (type->opcode() != spv::Op::OpTypeArray &&
          type->opcode() != spv::Op::OpTypeRuntimeArray) {
        return _.diag(SPV_ERROR_INVALID_DATA, variable)
               << _.VkErrorID(6778)
               << "PerVertexKHR must be declared as arrays";
      }
      has_per_vertex_khr = true;
    }
  }

  // Vulkan 14.1.3: Tessellation control and mesh per-vertex outputs and
  // tessellation control, evaluation and geometry per-vertex inputs have a
  // layer of arraying that is not included in interface matching.
  bool is_arrayed = false;
  switch (entry_point->GetOperandAs<spv::ExecutionModel>(0)) {
    case spv::ExecutionModel::TessellationControl:
      if (!has_patch) {
        is_arrayed = true;
      }
      break;
    case spv::ExecutionModel::TessellationEvaluation:
      if (!is_output && !has_patch) {
        is_arrayed = true;
      }
      break;
    case spv::ExecutionModel::Geometry:
      if (!is_output) {
        is_arrayed = true;
      }
      break;
    case spv::ExecutionModel::Fragment:
      if (!is_output && has_per_vertex_khr) {
        is_arrayed = true;
      }
      break;
    case spv::ExecutionModel::MeshNV:
      if (is_output && !has_per_task_nv) {
        is_arrayed = true;
      }
      break;
    default:
      break;
  }

  // Unpack arrayness.
  if (is_arrayed && (type->opcode() == spv::Op::OpTypeArray ||
                     type->opcode() == spv::Op::OpTypeRuntimeArray)) {
    type_id = type->GetOperandAs<uint32_t>(1);
    type = _.FindDef(type_id);
  }

  if (type->opcode() == spv::Op::OpTypeStruct) {
    // Don't check built-ins.
    if (_.HasDecoration(type_id, spv::Decoration::BuiltIn)) return SPV_SUCCESS;
  }

  // Only block-decorated structs don't need a location on the variable.
  const bool is_block = _.HasDecoration(type_id, spv::Decoration::Block);
  if (!has_location && !is_block) {
    const auto vuid = (type->opcode() == spv::Op::OpTypeStruct) ? 4917 : 4916;
    return _.diag(SPV_ERROR_INVALID_DATA, variable)
           << _.VkErrorID(vuid) << "Variable must be decorated with a location";
  }

  const std::string storage_class = is_output ? "output" : "input";
  if (has_location) {
    auto sub_type = type;
    bool is_int = false;
    bool is_const = false;
    uint32_t array_size = 1;
    // If the variable is still arrayed, mark the locations/components per
    // index.
    if (type->opcode() == spv::Op::OpTypeArray) {
      // Determine the array size if possible and get the element type.
      std::tie(is_int, is_const, array_size) =
          _.EvalInt32IfConst(type->GetOperandAs<uint32_t>(2));
      if (!is_int || !is_const) array_size = 1;
      auto sub_type_id = type->GetOperandAs<uint32_t>(1);
      sub_type = _.FindDef(sub_type_id);
    }

    uint32_t num_locations = 0;
    if (auto error = NumConsumedLocations(_, sub_type, &num_locations))
      return error;
    uint32_t num_components = NumConsumedComponents(_, sub_type);

    for (uint32_t array_idx = 0; array_idx < array_size; ++array_idx) {
      uint32_t array_location = location + (num_locations * array_idx);
      uint32_t start = array_location * 4;
      if (kMaxLocations <= start) {
        // Too many locations, give up.
        break;
      }

      uint32_t end = (array_location + num_locations) * 4;
      if (num_components != 0) {
        start += component;
        end = array_location * 4 + component + num_components;
      }

      auto locs = locations;
      if (has_index && index == 1) locs = output_index1_locations;

      for (uint32_t i = start; i < end; ++i) {
        if (!locs->insert(i).second) {
          return _.diag(SPV_ERROR_INVALID_DATA, entry_point)
                 << (is_output ? _.VkErrorID(8722) : _.VkErrorID(8721))
                 << "Entry-point has conflicting " << storage_class
                 << " location assignment at location " << i / 4
                 << ", component " << i % 4;
        }
      }
    }
  } else {
    // For Block-decorated structs with no location assigned to the variable,
    // each member of the block must be assigned a location. Also record any
    // member component assignments. The validator allows duplicate decorations
    // if they agree on the location/component.
    std::unordered_map<uint32_t, uint32_t> member_locations;
    std::unordered_map<uint32_t, uint32_t> member_components;
    for (auto& dec : _.id_decorations(type_id)) {
      if (dec.dec_type() == spv::Decoration::Location) {
        auto where = member_locations.find(dec.struct_member_index());
        if (where == member_locations.end()) {
          member_locations[dec.struct_member_index()] = dec.params()[0];
        } else if (where->second != dec.params()[0]) {
          return _.diag(SPV_ERROR_INVALID_DATA, type)
                 << "Member index " << dec.struct_member_index()
                 << " has conflicting location assignments";
        }
      } else if (dec.dec_type() == spv::Decoration::Component) {
        auto where = member_components.find(dec.struct_member_index());
        if (where == member_components.end()) {
          member_components[dec.struct_member_index()] = dec.params()[0];
        } else if (where->second != dec.params()[0]) {
          return _.diag(SPV_ERROR_INVALID_DATA, type)
                 << "Member index " << dec.struct_member_index()
                 << " has conflicting component assignments";
        }
      }
    }

    for (uint32_t i = 1; i < type->operands().size(); ++i) {
      auto where = member_locations.find(i - 1);
      if (where == member_locations.end()) {
        return _.diag(SPV_ERROR_INVALID_DATA, type)
               << _.VkErrorID(4919) << "Member index " << i - 1
               << " is missing a location assignment";
      }

      location = where->second;
      auto member = _.FindDef(type->GetOperandAs<uint32_t>(i));
      uint32_t num_locations = 0;
      if (auto error = NumConsumedLocations(_, member, &num_locations))
        return error;

      // If the component is not specified, it is assumed to be zero.
      uint32_t num_components = NumConsumedComponents(_, member);
      component = 0;
      if (member_components.count(i - 1)) {
        component = member_components[i - 1];
      }

      uint32_t start = location * 4;
      if (kMaxLocations <= start) {
        // Too many locations, give up.
        continue;
      }

      if (member->opcode() == spv::Op::OpTypeArray && num_components >= 1 &&
          num_components < 4) {
        // When an array has an element that takes less than a location in
        // size, calculate the used locations in a strided manner.
        for (uint32_t l = location; l < num_locations + location; ++l) {
          for (uint32_t c = component; c < component + num_components; ++c) {
            uint32_t check = 4 * l + c;
            if (!locations->insert(check).second) {
              return _.diag(SPV_ERROR_INVALID_DATA, entry_point)
                     << (is_output ? _.VkErrorID(8722) : _.VkErrorID(8721))
                     << "Entry-point has conflicting " << storage_class
                     << " location assignment at location " << l
                     << ", component " << c;
            }
          }
        }
      } else {
        // TODO: There is a hole here is the member is an array of 3- or
        // 4-element vectors of 64-bit types.
        uint32_t end = (location + num_locations) * 4;
        if (num_components != 0) {
          start += component;
          end = location * 4 + component + num_components;
        }
        for (uint32_t l = start; l < end; ++l) {
          if (!locations->insert(l).second) {
            return _.diag(SPV_ERROR_INVALID_DATA, entry_point)
                   << (is_output ? _.VkErrorID(8722) : _.VkErrorID(8721))
                   << "Entry-point has conflicting " << storage_class
                   << " location assignment at location " << l / 4
                   << ", component " << l % 4;
          }
        }
      }
    }
  }

  return SPV_SUCCESS;
}